

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O0

int dumpFields(MPI_Comm Region,double **U,double **V,double **P,lattice *grid,int n)

{
  char *pcVar1;
  undefined8 in_RDI;
  uint in_R9D;
  char *mode;
  char uFile [32];
  char pFile [32];
  MPI_Status st;
  int send;
  int size;
  int rank;
  size_t in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  double **in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffffa0;
  undefined1 local_50 [24];
  int local_38;
  int local_34;
  int local_30;
  uint local_2c;
  undefined8 local_8;
  
  local_38 = 1;
  local_2c = in_R9D;
  local_8 = in_RDI;
  MPI_Comm_rank(in_RDI,&local_30);
  MPI_Comm_size(local_8,&local_34);
  pcVar1 = "ab";
  if (local_30 == 0) {
    pcVar1 = "wb";
  }
  sprintf(&stack0xffffffffffffff88,"PressureField_%i.vtk",(ulong)local_2c);
  sprintf(&stack0xffffffffffffff68,"MomentumField_%i.vtk",(ulong)local_2c);
  if (0 < local_30) {
    MPI_Recv(&local_38,1,&ompi_mpi_int,local_30 + -1,0x100,local_8,local_50);
  }
  write2Dfield(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               in_stack_ffffffffffffffa0);
  if (local_30 + 1 != local_34) {
    MPI_Send(&local_38,0,&ompi_mpi_int,local_30 + 1,0x100,local_8,pcVar1);
  }
  if (0 < local_30) {
    MPI_Recv(&local_38,0,&ompi_mpi_int,local_30 + -1,0x101,local_8,local_50);
  }
  write2Dfield(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               in_stack_ffffffffffffffa0);
  pcVar1 = "ab";
  write2Dfield(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               in_stack_ffffffffffffffa0);
  if (local_30 + 1 != local_34) {
    MPI_Send(&local_38,0,&ompi_mpi_int,local_30 + 1,0x101,local_8,pcVar1);
  }
  return local_38;
}

Assistant:

int dumpFields (MPI_Comm Region, REAL **U, REAL **V, REAL **P, lattice *grid, int n)
{
	int rank, size, send = 1;
	MPI_Comm_rank(Region,&rank);
	MPI_Comm_size(Region,&size);
	MPI_Status st;
	char pFile[32], uFile[32];
	char *mode = (rank == 0 ? "wb" : "ab");
	sprintf(pFile,"PressureField_%i.vtk",n);
	sprintf(uFile,"MomentumField_%i.vtk",n);
	if (rank > 0)
		MPI_Recv(&send,1,MPI_INT,rank-1,WRITE + 0, Region, &st);
	write2Dfield(pFile,P,grid->deli,grid->delj,1,1,mode);
	if (rank+1 != size)
		MPI_Send(&send,0,MPI_INT,rank+1,WRITE + 0, Region);
	if (rank > 0)
		MPI_Recv(&send,0,MPI_INT,rank-1,WRITE + 1,Region,&st);
	write2Dfield(uFile,U,grid->deli+1,grid->delj+1,1,0,mode);
	write2Dfield(uFile,V,grid->deli+1,grid->delj+1,0,1,"ab");
	if (rank+1 != size)
		MPI_Send(&send,0,MPI_INT,rank+1,WRITE + 1,Region);
	return send;
}